

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O1

void __thiscall setup::item::load_condition_data(item *this,istream *is,info *i)

{
  uint uVar1;
  
  uVar1 = (i->version).value;
  if ((uVar1 < 0x2000000) &&
     ((uVar1 < 0x1030800 || (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) == 0))))
  {
    (this->components)._M_string_length = 0;
    *(this->components)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->components,i->codepage,(bitset<256UL> *)0x0);
  }
  uVar1 = (i->version).value;
  if ((uVar1 < 0x2000000) &&
     ((uVar1 < 0x1031100 || (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) == 0))))
  {
    (this->tasks)._M_string_length = 0;
    *(this->tasks)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->tasks,i->codepage,(bitset<256UL> *)0x0);
  }
  if ((i->version).value < 0x4000100) {
    (this->languages)._M_string_length = 0;
    *(this->languages)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->languages,i->codepage,(bitset<256UL> *)0x0);
  }
  uVar1 = (i->version).value;
  if ((uVar1 < 0x4000000) &&
     ((uVar1 < 0x1031800 || (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 4) == 0))))
  {
    (this->check)._M_string_length = 0;
    *(this->check)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->check,i->codepage,(bitset<256UL> *)0x0);
  }
  if (0x400ffff < (i->version).value) {
    util::encoded_string::load(is,&this->after_install,i->codepage,(bitset<256UL> *)0x0);
    util::encoded_string::load(is,&this->before_install,i->codepage,(bitset<256UL> *)0x0);
    return;
  }
  (this->after_install)._M_string_length = 0;
  *(this->after_install)._M_dataplus._M_p = '\0';
  (this->before_install)._M_string_length = 0;
  *(this->before_install)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void item::load_condition_data(std::istream & is, const info & i) {
	
	if(i.version >= INNO_VERSION(2, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 8))) {
		is >> util::encoded_string(components, i.codepage);
	} else {
		components.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 17))) {
		is >> util::encoded_string(tasks, i.codepage);
	} else {
		tasks.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		is >> util::encoded_string(after_install, i.codepage);
		is >> util::encoded_string(before_install, i.codepage);
	} else {
		after_install.clear(), before_install.clear();
	}
	
}